

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

float * __thiscall google::protobuf::RepeatedField<float>::at(RepeatedField<float> *this,int index)

{
  LogMessage *pLVar1;
  float *pfVar2;
  LogMessage local_60;
  LogFinisher local_21;
  
  if (index < 0) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/repeated_field.h"
               ,0x51e);
    pLVar1 = internal::LogMessage::operator<<(&local_60,"CHECK failed: (index) >= (0): ");
    internal::LogFinisher::operator=(&local_21,pLVar1);
    internal::LogMessage::~LogMessage(&local_60);
  }
  if (this->current_size_ <= index) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/repeated_field.h"
               ,0x51f);
    pLVar1 = internal::LogMessage::operator<<(&local_60,"CHECK failed: (index) < (current_size_): ")
    ;
    internal::LogFinisher::operator=(&local_21,pLVar1);
    internal::LogMessage::~LogMessage(&local_60);
  }
  pfVar2 = elements(this);
  return pfVar2 + index;
}

Assistant:

inline Element& RepeatedField<Element>::at(int index) {
  GOOGLE_CHECK_GE(index, 0);
  GOOGLE_CHECK_LT(index, current_size_);
  return elements()[index];
}